

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O0

Status __thiscall leveldb::TableBuilder::ChangeOptions(TableBuilder *this,Options *options)

{
  long *in_RDX;
  Slice local_40;
  Slice local_30;
  long *local_20;
  Options *options_local;
  TableBuilder *this_local;
  
  options_local = options;
  this_local = this;
  if ((_func_int **)*in_RDX == options->comparator->_vptr_Comparator) {
    local_20 = in_RDX;
    memcpy(options->comparator,in_RDX,0x60);
    memcpy(options->comparator + 0xc,local_20,0x60);
    *(undefined4 *)&options->comparator[0x14]._vptr_Comparator = 1;
    Status::OK();
  }
  else {
    Slice::Slice(&local_30,"changing comparator while building table");
    Slice::Slice(&local_40);
    Status::InvalidArgument((Status *)this,&local_30,&local_40);
  }
  return (Status)(char *)this;
}

Assistant:

Status TableBuilder::ChangeOptions(const Options& options) {
  // Note: if more fields are added to Options, update
  // this function to catch changes that should not be allowed to
  // change in the middle of building a Table.
  if (options.comparator != rep_->options.comparator) {
    return Status::InvalidArgument("changing comparator while building table");
  }

  // Note that any live BlockBuilders point to rep_->options and therefore
  // will automatically pick up the updated options.
  rep_->options = options;
  rep_->index_block_options = options;
  rep_->index_block_options.block_restart_interval = 1;
  return Status::OK();
}